

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O3

iterator_range<std::_Fwd_list_const_iterator<int>_> __thiscall
burst::algorithm::
bitap<int,std::bitset<32ul>,std::map<int,std::bitset<32ul>,std::less<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
::active_search<std::_Fwd_list_const_iterator<int>>
          (bitap<int,std::bitset<32ul>,std::map<int,std::bitset<32ul>,std::less<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
           *this,_Fwd_list_const_iterator<int> match_candidate,
          _Fwd_list_const_iterator<int> corpus_current,_Fwd_list_const_iterator<int> corpus_end,
          bitmask_type *hint)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  iterator_range<std::_Fwd_list_const_iterator<int>_> iVar9;
  
  uVar3 = *(long *)(*(long *)this + 0x30) - 1;
  uVar5 = 0;
  if (uVar3 < 0x20) {
    uVar5 = (uint)(1L << ((byte)uVar3 & 0x3f));
  }
  uVar3 = (hint->super__Base_bitset<1UL>)._M_w;
  do {
    uVar2 = (uint)uVar3;
    if ((corpus_current._M_node == corpus_end._M_node) || ((uVar2 & uVar5) != 0)) {
      if ((uVar2 & uVar5) == 0) {
        corpus_current._M_node = corpus_end._M_node;
        match_candidate._M_node = corpus_end._M_node;
      }
      iVar9.
      super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
      .m_End._M_node = corpus_current._M_node;
      iVar9.
      super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin._M_node = match_candidate._M_node;
      return (iterator_range<std::_Fwd_list_const_iterator<int>_>)
             iVar9.
             super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
      ;
    }
    lVar8 = *(long *)(*(long *)this + 0x10);
    if (lVar8 == 0) {
LAB_001fbf16:
      uVar6 = 0;
    }
    else {
      lVar7 = *(long *)this + 8;
      iVar1 = *(int *)&corpus_current._M_node[1]._M_next;
      lVar4 = lVar7;
      do {
        if (iVar1 <= *(int *)(lVar8 + 0x20)) {
          lVar4 = lVar8;
        }
        lVar8 = *(long *)(lVar8 + 0x10 + (ulong)(*(int *)(lVar8 + 0x20) < iVar1) * 8);
      } while (lVar8 != 0);
      if ((lVar4 == lVar7) || (iVar1 < *(int *)(lVar4 + 0x20))) goto LAB_001fbf16;
      uVar6 = (uint)*(undefined8 *)(lVar4 + 0x28);
    }
    uVar3 = (ulong)(uVar2 * 2 + 1 & uVar6);
    (hint->super__Base_bitset<1UL>)._M_w = uVar3;
    corpus_current._M_node = (corpus_current._M_node)->_M_next;
    match_candidate._M_node = (match_candidate._M_node)->_M_next;
  } while( true );
}

Assistant:

boost::iterator_range<ForwardIterator>
                active_search
                (
                    ForwardIterator match_candidate,
                    ForwardIterator corpus_current,
                    ForwardIterator corpus_end,
                    bitmask_type & hint
                ) const
            {
                // Индикатор совпадения — единица на N-м месте в битовой маске,
                // где N — количество элементов в искомом образце.
                const auto match_indicator =
                    left_shift(bitmask_type{0b1}, m_bitmask_table->length() - 1u);
                auto & match_column = hint;

                while (corpus_current != corpus_end && (match_column & match_indicator) == 0)
                {
                    match_column = bit_shift(match_column) & (*m_bitmask_table)[*corpus_current];
                    ++corpus_current;
                    ++match_candidate;
                }

                return (match_column & match_indicator) == 0
                    ? boost::make_iterator_range(corpus_end, corpus_end)
                    : boost::make_iterator_range(match_candidate, corpus_current);
            }